

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

Block * __thiscall
wasm::I64ToI32Lowering::lowerEq
          (I64ToI32Lowering *this,Block *result,TempVar *leftLow,TempVar *leftHigh,TempVar *rightLow
          ,TempVar *rightHigh)

{
  Index IVar1;
  Builder *this_00;
  Builder *pBVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Binary *this_01;
  Binary *this_02;
  Binary *this_03;
  Block *pBVar5;
  
  if (leftLow->moved != true) {
    this_00 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar1 = leftLow->idx;
    pEVar3 = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x18,8);
    pEVar3->_id = LocalGetId;
    *(Index *)(pEVar3 + 1) = IVar1;
    (pEVar3->type).id = 2;
    if (rightLow->moved != true) {
      IVar1 = rightLow->idx;
      pEVar4 = (Expression *)
               MixedArena::allocSpace
                         (&((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                           allocator,0x18,8);
      pEVar4->_id = LocalGetId;
      *(Index *)(pEVar4 + 1) = IVar1;
      (pEVar4->type).id = 2;
      this_01 = (Binary *)MixedArena::allocSpace(&this_00->wasm->allocator,0x28,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      this_01->op = EqInt32;
      this_01->left = pEVar3;
      this_01->right = pEVar4;
      Binary::finalize(this_01);
      if (leftHigh->moved != true) {
        pBVar2 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        IVar1 = leftHigh->idx;
        pEVar3 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
        pEVar3->_id = LocalGetId;
        *(Index *)(pEVar3 + 1) = IVar1;
        (pEVar3->type).id = 2;
        if (rightHigh->moved != true) {
          IVar1 = rightHigh->idx;
          pEVar4 = (Expression *)
                   MixedArena::allocSpace
                             (&((this->builder)._M_t.
                                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                               allocator,0x18,8);
          pEVar4->_id = LocalGetId;
          *(Index *)(pEVar4 + 1) = IVar1;
          (pEVar4->type).id = 2;
          this_02 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
          (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
               BinaryId;
          (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0
          ;
          this_02->op = EqInt32;
          this_02->left = pEVar3;
          this_02->right = pEVar4;
          Binary::finalize(this_02);
          this_03 = (Binary *)MixedArena::allocSpace(&this_00->wasm->allocator,0x28,8);
          (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
               BinaryId;
          (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0
          ;
          this_03->op = AndInt32;
          this_03->left = (Expression *)this_01;
          this_03->right = (Expression *)this_02;
          Binary::finalize(this_03);
          pBVar5 = Builder::blockify(this_00,(Expression *)result,(Expression *)this_03);
          return pBVar5;
        }
      }
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

Block* lowerEq(Block* result,
                 TempVar&& leftLow,
                 TempVar&& leftHigh,
                 TempVar&& rightLow,
                 TempVar&& rightHigh) {
    return builder->blockify(
      result,
      builder->makeBinary(
        AndInt32,
        builder->makeBinary(EqInt32,
                            builder->makeLocalGet(leftLow, Type::i32),
                            builder->makeLocalGet(rightLow, Type::i32)),
        builder->makeBinary(EqInt32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeLocalGet(rightHigh, Type::i32))));
  }